

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O1

Sprite __thiscall nesvis::PpuHelper::get_sprite(PpuHelper *this,uint8_t sprite_index)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  IPpu *pIVar5;
  byte bVar6;
  
  bVar6 = sprite_index * '\x04';
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  (*pIVar5->_vptr_IPpu[3])(pIVar5,0x2003,(ulong)bVar6);
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  uVar1 = (*pIVar5->_vptr_IPpu[2])(pIVar5,0x2004);
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  (*pIVar5->_vptr_IPpu[3])(pIVar5,0x2003,(ulong)(byte)(bVar6 + 1));
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  uVar2 = (*pIVar5->_vptr_IPpu[2])(pIVar5,0x2004);
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  (*pIVar5->_vptr_IPpu[3])(pIVar5,0x2003,(ulong)(byte)(bVar6 + 2));
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  iVar3 = (*pIVar5->_vptr_IPpu[2])(pIVar5,0x2004);
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  (*pIVar5->_vptr_IPpu[3])(pIVar5,0x2003,(ulong)(bVar6 | 3));
  pIVar5 = n_e_s::nes::Nes::ppu(this->nes_);
  uVar4 = (*pIVar5->_vptr_IPpu[2])(pIVar5,0x2004);
  bVar6 = (byte)iVar3;
  return (Sprite)((ulong)(uVar4 & 0xff) |
                 (ulong)((uVar1 & 0xff) << 8) |
                 (ulong)((uVar2 & 0xff) << 0x10) |
                 (ulong)(uint)(iVar3 << 0x18) |
                 (ulong)(bVar6 & 3) << 0x20 |
                 (ulong)(bVar6 >> 5 & 1) << 0x28 |
                 (ulong)(bVar6 >> 6 & 1) << 0x30 | (ulong)(bVar6 >> 7) << 0x38);
}

Assistant:

PpuHelper::Sprite PpuHelper::get_sprite(uint8_t sprite_index) {
    constexpr uint16_t kOamAddr = 0x2003;
    constexpr uint16_t kOamData = 0x2004;
    const uint8_t oam_addr = sprite_index * 4u;

    nes_->ppu().write_byte(kOamAddr, oam_addr);
    const uint8_t y = nes_->ppu().read_byte(kOamData);
    nes_->ppu().write_byte(kOamAddr, oam_addr + 1u);
    const uint8_t tile_index = nes_->ppu().read_byte(kOamData);
    nes_->ppu().write_byte(kOamAddr, oam_addr + 2u);
    const uint8_t attribute = nes_->ppu().read_byte(kOamData);
    nes_->ppu().write_byte(kOamAddr, oam_addr + 3u);
    const uint8_t x = nes_->ppu().read_byte(kOamData);

    const bool flip_vertically = attribute & 0b1000'0000u;
    const bool flip_horizontally = attribute & 0b0100'0000u;
    const bool front_of_bkg = attribute & 0b0010'0000u;
    const uint8_t palette = attribute & 0b0000'0011u;

    return {.x = x,
            .y = y,
            .tile_index = tile_index,
            .attribute = attribute,
            .palette = palette,
            .front_of_bkg = front_of_bkg,
            .flip_horizontally = flip_horizontally,
            .flip_vertically = flip_vertically};
}